

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::AssignDescriptorsHelper::AssignMessageDescriptor
          (AssignDescriptorsHelper *this,Descriptor *descriptor)

{
  int iVar1;
  MigrationSchema *pMVar2;
  uint32 *puVar3;
  Reflection *this_00;
  DescriptorPool *pool;
  int i_1;
  int *piVar4;
  int i;
  long lVar5;
  long lVar6;
  ReflectionSchema result;
  
  lVar6 = 0;
  for (lVar5 = 0; lVar5 < *(int *)(descriptor + 0x70); lVar5 = lVar5 + 1) {
    AssignMessageDescriptor(this,(Descriptor *)(*(long *)(descriptor + 0x38) + lVar6));
    lVar6 = lVar6 + 0x90;
  }
  this->file_level_metadata_->descriptor = descriptor;
  this_00 = (Reflection *)operator_new(0x50);
  pMVar2 = this->schemas_;
  puVar3 = this->offsets_;
  lVar5._0_4_ = pMVar2->offsets_index;
  lVar5._4_4_ = pMVar2->has_bit_indices_index;
  result.object_size_ = pMVar2->object_size;
  result.default_instance_ = *this->default_instance_data_;
  lVar6 = lVar5 << 0x20;
  piVar4 = (int *)((lVar6 >> 0x1e) + (long)puVar3);
  result.offsets_ = (uint32 *)(piVar4 + 5);
  result.has_bit_indices_ = puVar3 + (lVar5 >> 0x20);
  result.has_bits_offset_ = *piVar4;
  result.metadata_offset_ = *(int *)((long)puVar3 + (lVar6 + 0x100000000 >> 0x1e));
  result.extensions_offset_ = *(int *)((long)puVar3 + (lVar6 + 0x200000000 >> 0x1e));
  result.oneof_case_offset_ = *(int *)((long)puVar3 + (lVar6 + 0x300000000 >> 0x1e));
  result.weak_field_map_offset_ = *(int *)((long)puVar3 + (lVar6 + 0x400000000 >> 0x1e));
  pool = DescriptorPool::internal_generated_pool();
  Reflection::Reflection(this_00,descriptor,&result,pool,this->factory_);
  this->file_level_metadata_->reflection = this_00;
  iVar1 = *(int *)(descriptor + 0x74);
  lVar5 = 0;
  for (lVar6 = 0; lVar6 < iVar1; lVar6 = lVar6 + 1) {
    *this->file_level_enum_descriptors_ = (EnumDescriptor *)(*(long *)(descriptor + 0x40) + lVar5);
    this->file_level_enum_descriptors_ = this->file_level_enum_descriptors_ + 1;
    lVar5 = lVar5 + 0x50;
  }
  this->schemas_ = this->schemas_ + 1;
  this->default_instance_data_ = this->default_instance_data_ + 1;
  this->file_level_metadata_ = this->file_level_metadata_ + 1;
  return;
}

Assistant:

void AssignMessageDescriptor(const Descriptor* descriptor) {
    for (int i = 0; i < descriptor->nested_type_count(); i++) {
      AssignMessageDescriptor(descriptor->nested_type(i));
    }

    file_level_metadata_->descriptor = descriptor;

    file_level_metadata_->reflection =
        new Reflection(descriptor,
                       MigrationToReflectionSchema(default_instance_data_,
                                                   offsets_, *schemas_),
                       DescriptorPool::internal_generated_pool(), factory_);
    for (int i = 0; i < descriptor->enum_type_count(); i++) {
      AssignEnumDescriptor(descriptor->enum_type(i));
    }
    schemas_++;
    default_instance_data_++;
    file_level_metadata_++;
  }